

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O1

void __thiscall btCollisionWorld::updateAabbs(btCollisionWorld *this)

{
  int iVar1;
  btCollisionObject *colObj;
  long lVar2;
  
  CProfileManager::Start_Profile("updateAabbs");
  if (0 < (this->m_collisionObjects).m_size) {
    lVar2 = 0;
    do {
      colObj = (this->m_collisionObjects).m_data[lVar2];
      if ((this->m_forceUpdateAllAabbs != false) ||
         ((iVar1 = colObj->m_activationState1, iVar1 != 2 && (iVar1 != 5)))) {
        updateSingleAabb(this,colObj);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->m_collisionObjects).m_size);
  }
  CProfileManager::Stop_Profile();
  return;
}

Assistant:

void	btCollisionWorld::updateAabbs()
{
	BT_PROFILE("updateAabbs");

	btTransform predictedTrans;
	for ( int i=0;i<m_collisionObjects.size();i++)
	{
		btCollisionObject* colObj = m_collisionObjects[i];

		//only update aabb of active objects
		if (m_forceUpdateAllAabbs || colObj->isActive())
		{
			updateSingleAabb(colObj);
		}
	}
}